

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser * init_parse_ghost(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_ghost_name);
  parser_reg(p,"freq uint exists int add",parse_ghost_freq);
  parser_reg(p,"cut-off int level",parse_ghost_cutoff);
  parser_reg(p,"spell-power uint mult uint div",parse_ghost_spell_power);
  parser_reg(p,"hearing int hearing",parse_ghost_hearing);
  parser_reg(p,"hit-points uint mult uint div",parse_ghost_hit_points);
  parser_reg(p,"armor-class uint mult uint div",parse_ghost_armor_class);
  parser_reg(p,"blow-sides uint mult uint div",parse_ghost_blow_sides);
  parser_reg(p,"speed int add int max",parse_ghost_speed);
  parser_reg(p,"blow-effect1 sym effect",parse_ghost_blow_effect1);
  parser_reg(p,"blow-effect2 sym effect",parse_ghost_blow_effect2);
  parser_reg(p,"flags ?str flags",parse_ghost_flags);
  parser_reg(p,"flags-off ?str flags",parse_ghost_flags_off);
  parser_reg(p,"spells str spells",parse_ghost_spells);
  parser_reg(p,"spells-off str spells",parse_ghost_spells_off);
  return p;
}

Assistant:

static struct parser *init_parse_ghost(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);

	parser_reg(p, "name str name", parse_ghost_name);
	parser_reg(p, "freq uint exists int add", parse_ghost_freq);
	parser_reg(p, "cut-off int level", parse_ghost_cutoff);
	parser_reg(p, "spell-power uint mult uint div", parse_ghost_spell_power);
	parser_reg(p, "hearing int hearing", parse_ghost_hearing);
	parser_reg(p, "hit-points uint mult uint div", parse_ghost_hit_points);
	parser_reg(p, "armor-class uint mult uint div", parse_ghost_armor_class);
	parser_reg(p, "blow-sides uint mult uint div", parse_ghost_blow_sides);
	parser_reg(p, "speed int add int max", parse_ghost_speed);
	parser_reg(p, "blow-effect1 sym effect", parse_ghost_blow_effect1);
	parser_reg(p, "blow-effect2 sym effect", parse_ghost_blow_effect2);
	parser_reg(p, "flags ?str flags", parse_ghost_flags);
	parser_reg(p, "flags-off ?str flags", parse_ghost_flags_off);
	parser_reg(p, "spells str spells", parse_ghost_spells);
	parser_reg(p, "spells-off str spells", parse_ghost_spells_off);
	return p;
}